

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initkbd.c
# Opt level: O3

void keyboardtype(int fd)

{
  ushort uVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  IFPAGE *pIVar5;
  int iVar6;
  byte *__s2;
  u_char *__s;
  long lVar7;
  bool bVar8;
  int i;
  ulong uVar9;
  long lVar10;
  ushort uVar11;
  DLword DVar12;
  int *piVar13;
  int iVar14;
  uint uVar15;
  int maxkey;
  int minkey;
  int symspercode;
  int lisp_codes_used [256];
  int local_444;
  uint local_440;
  int local_43c;
  int local_438 [258];
  
  pIVar5 = InterfacePage;
  uVar1 = InterfacePage->devconfig;
  uVar11 = uVar1 & 0xfff8;
  InterfacePage->devconfig = uVar11;
  __s2 = (byte *)getenv("LDEKBDTYPE");
  if (__s2 == (byte *)0x0) goto LAB_00127ad0;
  iVar6 = strcmp("as3000j",(char *)__s2);
  if (iVar6 == 0) {
    SUNLispKeyMap = SUNLispKeyMap_for4;
    pIVar5->devconfig = uVar1 | 7;
    return;
  }
  iVar6 = strcmp("type4",(char *)__s2);
  if (iVar6 != 0) {
    iVar6 = strcmp("type2",(char *)__s2);
    if (iVar6 != 0) {
      iVar6 = strcmp("jle",(char *)__s2);
      if (iVar6 == 0) {
        SUNLispKeyMap = SUNLispKeyMap_jle;
        DVar12 = uVar11 | 2;
        goto LAB_00127c4e;
      }
      if (*__s2 == 0x58) {
        if (__s2[1] == 0) {
LAB_00127ad0:
          __s = (u_char *)malloc(0x100);
          iVar6 = 0;
          memset(local_438,0,0x400);
          memset(__s,0xff,0x100);
          XDisplayKeycodes(currentdsp->display_id,&local_440,&local_444);
          iVar14 = (local_444 - local_440) + 1;
          lVar7 = XGetKeyboardMapping(currentdsp->display_id,local_440 & 0xff,iVar14,&local_43c);
          uVar15 = iVar14 * local_43c;
          piVar13 = generic_X_keymap;
          bVar3 = false;
          iVar14 = -1;
          do {
            iVar2 = piVar13[2];
            bVar8 = iVar2 == iVar14 && bVar3;
            bVar4 = !bVar3;
            bVar3 = bVar8;
            if ((iVar2 != iVar14 || bVar4) && (0 < (int)uVar15)) {
              iVar14 = piVar13[1];
              uVar9 = 0;
              do {
                if ((*(long *)(lVar7 + uVar9 * 8) == (long)iVar2) &&
                   (lVar10 = (long)(int)((long)((ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 |
                                               uVar9 & 0xffffffff) / (long)local_43c) +
                             (long)(int)local_440, __s[lVar10 + -7] == 0xff)) {
                  bVar3 = false;
                  if (((int)lVar10 != 0) && ((iVar6 != 0 || (local_438[iVar14] == 0)))) {
                    local_438[iVar14] = 1;
                    __s[lVar10 + -7] = (u_char)iVar14;
                    bVar3 = true;
                  }
                  goto LAB_00127bbd;
                }
                uVar9 = uVar9 + 1;
              } while (uVar15 != uVar9);
              bVar3 = false;
            }
LAB_00127bbd:
            piVar13 = piVar13 + 3;
            iVar6 = *piVar13;
            iVar14 = iVar2;
            if (iVar6 == -1) {
              XFree();
              SUNLispKeyMap = __s;
              XGenericKeyMap = __s;
              return;
            }
          } while( true );
        }
      }
      else {
        uVar15 = *__s2 - 0x78;
        if (uVar15 == 0) {
          uVar15 = (uint)__s2[1];
        }
        if (uVar15 == 0) goto LAB_00127ad0;
      }
      iVar6 = strcmp("sdl",(char *)__s2);
      if (iVar6 == 0) {
        sprintf((char *)local_438,"Unsupported keyboard type: %d",0x10);
        puts((char *)local_438);
        puts("Configuring keyboard for type-3");
      }
    }
    SUNLispKeyMap = SUNLispKeyMap_for3;
    return;
  }
  SUNLispKeyMap = SUNLispKeyMap_for4;
  DVar12 = uVar11 | 1;
LAB_00127c4e:
  pIVar5->devconfig = DVar12;
  return;
}

Assistant:

void keyboardtype(int fd)
{
  int type;
  int i;
  char *key;

#if defined(OS4)
  for (i = 0; i < 5000; i++) { /* IDLE LOOP */
  }                            /* because of a SunOS bug */
#endif

  /* clear the keyboard field in devconfig */
  InterfacePage->devconfig &= 0xfff8;

  /************************************************************
   Due to the problems of SunOS 4.0 & 4.0.1
   calling ioctl never return the correct keyboard type.
   So,these 2 lines are commented out ...(Take)->AR11100
  *************************************************************/

  /* Get keytype from LDEKBDTYPE  */
  if ((key = getenv("LDEKBDTYPE")) == 0) {
#ifdef XWINDOW
    type = KB_X;
#elif DOS
    type = KB_DOS;
#elif SDL
    type = KB_SDL;
#endif /* XWINDOW */
  } /* if end */
  else {
    if (strcmp("as3000j", key) == 0)
      type = KB_AS3000J;
    else if (strcmp("type4", key) == 0)
      type = KB_SUN4;
    else if (strcmp("type2", key) == 0)
      type = KB_SUN2;
    else if (strcmp("jle", key) == 0)
      type = KB_JLE;
    else if (strcmp("X", key) == 0 || strcmp("x", key) == 0)
      type = KB_X;
    else if (strcmp("sdl", key) == 0)
      type = KB_SDL;
    else
      type = KB_SUN3; /* default */
  }

  switch (type) {
    case KB_SUN2: /* type2, we still use keymap for type3 */
      SUNLispKeyMap = SUNLispKeyMap_for3;
      /* MIN_KEYTYPE is 3,so we can't set devconfig correctly */
      /* Therefore type2 may treat as type3 */
      InterfacePage->devconfig |= 0;
      break;
    case KB_SUN3: /* type3 */
      SUNLispKeyMap = SUNLispKeyMap_for3;
      InterfacePage->devconfig |= type - MIN_KEYTYPE;
      break;
    case KB_SUN4: /* type4 */
      SUNLispKeyMap = SUNLispKeyMap_for4;
      InterfacePage->devconfig |= type - MIN_KEYTYPE;
      break;
    case KB_JLE: /* JLE */
      /*printf("jle\n"); */
      SUNLispKeyMap = SUNLispKeyMap_jle;
      InterfacePage->devconfig |= type - MIN_KEYTYPE;
      /* InterfacePage->devconfig |= 4-MIN_KEYTYPE; */
      break;
    case KB_AS3000J: /* for AS, use type4 map */
      SUNLispKeyMap = SUNLispKeyMap_for4;
      InterfacePage->devconfig |= type - MIN_KEYTYPE; /* 7 */
      break;
#ifdef XWINDOW
    case KB_X:
      XGenericKeyMap = (u_char *)make_X_keymap();
      SUNLispKeyMap = XGenericKeyMap;
      InterfacePage->devconfig |= KB_SUN3 - MIN_KEYTYPE; /* 10 */
      break;
#endif /* XWINDOW */
#ifdef SDL
  case KB_SDL:
    InterfacePage->devconfig |= KB_SUN3 - MIN_KEYTYPE; /* 10 */
    break;
#endif /* SDL */
#ifdef DOS
    case KB_DOS:
      SUNLispKeyMap = DOSLispKeyMap_101;
      InterfacePage->devconfig |= KB_SUN3 - MIN_KEYTYPE; /* 10 */
      break;
#endif /* DOS */
    default: {
      char errmsg[200];
      sprintf(errmsg, "Unsupported keyboard type: %d", type);
      printf("%s\n", errmsg);
      printf("Configuring keyboard for type-3\n");
      SUNLispKeyMap = SUNLispKeyMap_for3;
      InterfacePage->devconfig |= KB_SUN3 - MIN_KEYTYPE;
      break;
    }
  }

}